

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void Cmd_addslotdefault(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  PClass *p;
  FString local_38;
  uint local_2c;
  PClassWeapon *pPStack_28;
  uint slot;
  PClassWeapon *type;
  APlayerPawn *pAStack_18;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  type._4_4_ = key;
  pAStack_18 = who;
  who_local = (APlayerPawn *)argv;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 3) {
    pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,1);
    local_2c = atoi(pcVar2);
    if (local_2c < 10) {
      pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,2);
      p = PClass::FindClass(pcVar2);
      pPStack_28 = dyn_cast<PClassWeapon>((DObject *)p);
      if (pPStack_28 == (PClassWeapon *)0x0) {
        pcVar2 = FCommandLine::operator[]((FCommandLine *)who_local,2);
        Printf("%s is not a weapon\n",pcVar2);
        return;
      }
      if ((ParsingKeyConf & 1U) != 0) {
        pcVar2 = FCommandLine::args((FCommandLine *)who_local);
        FString::FString(&local_38,pcVar2);
        TArray<FString,_FString>::Push(&KeyConfWeapons,&local_38);
        FString::~FString(&local_38);
        return;
      }
      if (PlayingKeyConf != (FWeaponSlots *)0x0) {
        FWeaponSlots::AddSlotDefault(PlayingKeyConf,local_2c,pPStack_28,false);
        return;
      }
      Net_WriteByte('7');
      Net_WriteByte((BYTE)local_2c);
      Net_WriteWeapon(pPStack_28);
      return;
    }
  }
  Printf("Usage: addslotdefault <slot> <weapon>\n");
  return;
}

Assistant:

CCMD (addslotdefault)
{
	PClassWeapon *type;
	unsigned int slot;

	if (argv.argc() != 3 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf ("Usage: addslotdefault <slot> <weapon>\n");
		return;
	}

	type = dyn_cast<PClassWeapon>(PClass::FindClass(argv[2]));
	if (type == NULL)
	{
		Printf ("%s is not a weapon\n", argv[2]);
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->AddSlotDefault(int(slot), type, false);
	}
	else
	{
		Net_WriteByte(DEM_ADDSLOTDEFAULT);
		Net_WriteByte(slot);
		Net_WriteWeapon(type);
	}
}